

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O0

Enumerator * __thiscall CParse::newEnumerator(CParse *this,string *ident)

{
  Enumerator *this_00;
  Enumerator *local_20;
  Enumerator *res;
  string *ident_local;
  CParse *this_local;
  
  res = (Enumerator *)ident;
  ident_local = (string *)this;
  this_00 = (Enumerator *)operator_new(0x30);
  Enumerator::Enumerator(this_00,&res->enumconstant);
  local_20 = this_00;
  std::__cxx11::list<Enumerator_*,_std::allocator<Enumerator_*>_>::push_back
            (&this->enum_alloc,&local_20);
  return local_20;
}

Assistant:

Enumerator *CParse::newEnumerator(const string &ident)

{
  Enumerator *res = new Enumerator(ident);
  enum_alloc.push_back(res);
  return res;
}